

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::Options(Options *this,Options *from)

{
  void *pvVar1;
  uint64 uVar2;
  int iVar3;
  int iVar4;
  int32 iVar5;
  bool bVar6;
  undefined3 uVar7;
  uint uVar8;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__Options_005bb3d0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->filename_,&from->filename_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->base_filename_,&from->base_filename_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->data_source_,&from->data_source_);
  google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::RepeatedPtrField
            (&this->custom_data_source_,&from->custom_data_source_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->debug_filename_,&from->debug_filename_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->source_map_,&from->source_map_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->disassemble_function_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  uVar8 = (from->_has_bits_).has_bits_[0];
  if ((uVar8 & 1) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->disassemble_function_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->disassemble_function_).ptr_);
    uVar8 = (from->_has_bits_).has_bits_[0];
  }
  (this->source_filter_).ptr_ =
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar8 & 2) != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->source_filter_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (from->source_filter_).ptr_);
  }
  this->max_rows_per_level_ = from->max_rows_per_level_;
  iVar3 = from->demangle_;
  iVar4 = from->sort_by_;
  iVar5 = from->verbose_level_;
  bVar6 = from->dump_raw_map_;
  uVar7 = *(undefined3 *)&from->field_0xc5;
  uVar2 = from->debug_fileoff_;
  this->debug_vmaddr_ = from->debug_vmaddr_;
  this->debug_fileoff_ = uVar2;
  this->demangle_ = iVar3;
  this->sort_by_ = iVar4;
  this->verbose_level_ = iVar5;
  this->dump_raw_map_ = bVar6;
  *(undefined3 *)&this->field_0xc5 = uVar7;
  return;
}

Assistant:

Options::Options(const Options& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      filename_(from.filename_),
      base_filename_(from.base_filename_),
      data_source_(from.data_source_),
      custom_data_source_(from.custom_data_source_),
      debug_filename_(from.debug_filename_),
      source_map_(from.source_map_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  disassemble_function_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_disassemble_function()) {
    disassemble_function_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.disassemble_function_);
  }
  source_filter_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_source_filter()) {
    source_filter_.AssignWithDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from.source_filter_);
  }
  ::memcpy(&demangle_, &from.demangle_,
    static_cast<size_t>(reinterpret_cast<char*>(&max_rows_per_level_) -
    reinterpret_cast<char*>(&demangle_)) + sizeof(max_rows_per_level_));
  // @@protoc_insertion_point(copy_constructor:bloaty.Options)
}